

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::releaseExport
          (RpcConnectionState *this,ExportId id,uint refcount)

{
  Export *entry;
  Fault local_78;
  Fault f_1;
  ClientHook *local_48 [3];
  Fault local_30;
  Fault f;
  Export *exp;
  uint refcount_local;
  ExportId id_local;
  RpcConnectionState *this_local;
  
  f.exception = (Exception *)
                ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
                ::find(&this->exports,id);
  entry = kj::_::readMaybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
                    ((Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Export_&> *)&f);
  if (entry == (Export *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xa65,FAILED,(char *)0x0,"\"Tried to release invalid export ID.\"",
               (char (*) [36])"Tried to release invalid export ID.");
    kj::_::Debug::Fault::~Fault(&local_78);
  }
  else if (entry->refcount < refcount) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xa5b,FAILED,"refcount <= exp->refcount",
               "\"Tried to drop export\'s refcount below zero.\"",
               (char (*) [44])"Tried to drop export\'s refcount below zero.");
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  else {
    entry->refcount = entry->refcount - refcount;
    if (entry->refcount == 0) {
      local_48[0] = kj::Own::operator_cast_to_ClientHook_((Own *)&entry->clientHook);
      std::
      unordered_map<capnp::ClientHook_*,_unsigned_int,_std::hash<capnp::ClientHook_*>,_std::equal_to<capnp::ClientHook_*>,_std::allocator<std::pair<capnp::ClientHook_*const,_unsigned_int>_>_>
      ::erase(&this->exportsByCap,local_48);
      ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>::erase
                ((Export *)&f_1,&this->exports,id,entry);
      Export::~Export((Export *)&f_1);
    }
  }
  return;
}

Assistant:

void releaseExport(ExportId id, uint refcount) {
    KJ_IF_MAYBE(exp, exports.find(id)) {
      KJ_REQUIRE(refcount <= exp->refcount, "Tried to drop export's refcount below zero.") {
        return;
      }

      exp->refcount -= refcount;
      if (exp->refcount == 0) {
        exportsByCap.erase(exp->clientHook);
        exports.erase(id, *exp);
      }
    } else {
      KJ_FAIL_REQUIRE("Tried to release invalid export ID.") {
        return;
      }